

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler>::
write_decimal<unsigned__int128>
          (arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::detail::error_handler> *this,
          unsigned___int128 value)

{
  undefined1 n [16];
  int iVar1;
  undefined8 in_RAX;
  checked_ptr<typename_buffer<char>::value_type> pcVar2;
  undefined8 unaff_RBX;
  detail *in_RSI;
  
  n._8_8_ = unaff_RBX;
  n._0_8_ = in_RAX;
  iVar1 = count_digits(in_RSI,(uint128_t)n);
  pcVar2 = arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::reserve
                     ((arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>
                       *)this,(long)iVar1);
  format_decimal<char,unsigned__int128,char*,fmt::v6::detail::format_decimal<char,char*,unsigned__int128>(char*,unsigned__int128,int)::_lambda(char*)_1_>
            (pcVar2);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }